

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_replace.h
# Opt level: O0

string * __thiscall
absl::lts_20250127::
StrReplaceAll<std::initializer_list<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
          (string *__return_storage_ptr__,lts_20250127 *this,string_view s,
          initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *replacements)

{
  string_view s_00;
  undefined1 local_40 [8];
  vector<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
  subs;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *replacements_local;
  string_view s_local;
  string *result;
  
  subs.
  super__Vector_base<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s._M_str;
  s_local._M_len = s._M_len;
  replacements_local =
       (initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        *)this;
  s_local._M_str = (char *)__return_storage_ptr__;
  strings_internal::
  FindSubstitutions<std::initializer_list<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
            ((vector<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
              *)local_40,(strings_internal *)this,s,replacements);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&replacements_local);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  s_00._M_str = local_40;
  s_00._M_len = s_local._M_len;
  strings_internal::ApplySubstitutions
            ((strings_internal *)replacements_local,s_00,
             (Nonnull<std::vector<strings_internal::ViableSubstitution>_*>)__return_storage_ptr__,
             (Nonnull<std::string_*>)replacements);
  std::
  vector<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
  ::~vector((vector<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string StrReplaceAll(absl::string_view s,
                          const StrToStrMapping& replacements) {
  auto subs = strings_internal::FindSubstitutions(s, replacements);
  std::string result;
  result.reserve(s.size());
  strings_internal::ApplySubstitutions(s, &subs, &result);
  return result;
}